

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  short sVar24;
  int iVar25;
  ulong uVar26;
  char *__format;
  int iVar27;
  uint uVar28;
  ushort uVar29;
  uint uVar30;
  int16_t iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  uint local_2d8;
  uint local_2d0;
  uint local_2c8;
  uint local_2c0;
  int16_t *local_2b0;
  undefined1 local_260 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  short local_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short sStack_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short sStack_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  undefined1 local_140 [32];
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined2 local_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined1 local_e0 [32];
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar21 = "_s2";
  }
  else {
    uVar20 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar21 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar21 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar21 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar21 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_00713a73:
        iVar16 = matrix->min;
        iVar25 = -iVar16;
        if (iVar16 != -open && SBORROW4(iVar16,-open) == iVar16 + open < 0) {
          iVar25 = open;
        }
        uVar30 = iVar25 - 0x7fff;
        sVar24 = 0x7ffe - (short)matrix->max;
        iVar31 = (int16_t)uVar30;
        local_180._2_2_ = iVar31;
        local_180._0_2_ = iVar31;
        local_180._4_2_ = iVar31;
        local_180._6_2_ = iVar31;
        local_180._8_2_ = iVar31;
        local_180._10_2_ = iVar31;
        local_180._12_2_ = iVar31;
        local_180._14_2_ = iVar31;
        local_180._16_2_ = iVar31;
        local_180._18_2_ = iVar31;
        local_180._20_2_ = iVar31;
        local_180._22_2_ = iVar31;
        local_180._24_2_ = iVar31;
        local_180._26_2_ = iVar31;
        local_180._28_2_ = iVar31;
        local_180._30_2_ = iVar31;
        local_200._2_2_ = iVar31;
        local_200._0_2_ = iVar31;
        local_200._4_2_ = iVar31;
        local_200._6_2_ = iVar31;
        local_200._8_2_ = iVar31;
        local_200._10_2_ = iVar31;
        local_200._12_2_ = iVar31;
        local_200._14_2_ = iVar31;
        local_200._16_2_ = iVar31;
        local_200._18_2_ = iVar31;
        local_200._20_2_ = iVar31;
        local_200._22_2_ = iVar31;
        local_200._24_2_ = iVar31;
        local_200._26_2_ = iVar31;
        local_200._28_2_ = iVar31;
        local_200._30_2_ = iVar31;
        ppVar17 = parasail_result_new();
        if (ppVar17 != (parasail_result_t *)0x0) {
          ppVar17->flag = ppVar17->flag | 0x10201004;
          uVar26 = (ulong)(s2Len + 0x1e);
          ptr = parasail_memalign_int16_t(0x20,uVar26);
          ptr_00 = parasail_memalign_int16_t(0x20,uVar26);
          ptr_01 = parasail_memalign_int16_t(0x20,uVar26);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar18 = (long)_s1Len;
            if (matrix->type == 0) {
              local_2b0 = parasail_memalign_int16_t(0x20,(long)(int)(_s1Len + 0xf));
              if (local_2b0 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              for (uVar26 = 0; lVar23 = lVar18, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar26;
                  uVar26 = uVar26 + 1) {
                local_2b0[uVar26] = (int16_t)matrix->mapper[(byte)_s1[uVar26]];
              }
              for (; lVar23 < (int)(_s1Len + 0xf); lVar23 = lVar23 + 1) {
                local_2b0[lVar23] = 0;
              }
            }
            else {
              local_2b0 = (int16_t *)0x0;
            }
            uVar14 = s2Len + 0xf;
            local_160 = sVar24;
            sStack_15e = sVar24;
            sStack_15c = sVar24;
            sStack_15a = sVar24;
            sStack_158 = sVar24;
            sStack_156 = sVar24;
            sStack_154 = sVar24;
            sStack_152 = sVar24;
            sStack_150 = sVar24;
            sStack_14e = sVar24;
            sStack_14c = sVar24;
            sStack_14a = sVar24;
            sStack_148 = sVar24;
            sStack_146 = sVar24;
            sStack_144 = sVar24;
            sStack_142 = sVar24;
            auVar5._2_2_ = iVar31;
            auVar5._0_2_ = iVar31;
            auVar5._4_2_ = iVar31;
            auVar5._6_2_ = iVar31;
            auVar5._8_2_ = iVar31;
            auVar5._10_2_ = iVar31;
            auVar5._12_2_ = iVar31;
            auVar5._14_2_ = iVar31;
            auVar9._16_2_ = iVar31;
            auVar9._0_16_ = auVar5;
            auVar9._18_2_ = iVar31;
            auVar9._20_2_ = iVar31;
            auVar9._22_2_ = iVar31;
            auVar9._24_2_ = iVar31;
            auVar9._26_2_ = iVar31;
            auVar9._28_2_ = iVar31;
            auVar9._30_2_ = iVar31;
            auVar33 = vpslldq_avx2(ZEXT1632(auVar5),0xe);
            local_e0 = vpblendw_avx2(auVar9,auVar33,0x80);
            local_80 = (undefined2)open;
            uStack_7e = local_80;
            uStack_7c = local_80;
            uStack_7a = local_80;
            uStack_78 = local_80;
            uStack_76 = local_80;
            uStack_74 = local_80;
            uStack_72 = local_80;
            uStack_70 = local_80;
            uStack_6e = local_80;
            uStack_6c = local_80;
            uStack_6a = local_80;
            uStack_68 = local_80;
            uStack_66 = local_80;
            uStack_64 = local_80;
            uStack_62 = local_80;
            local_a0 = (undefined2)gap;
            uStack_9e = local_a0;
            uStack_9c = local_a0;
            uStack_9a = local_a0;
            uStack_98 = local_a0;
            uStack_96 = local_a0;
            uStack_94 = local_a0;
            uStack_92 = local_a0;
            uStack_90 = local_a0;
            uStack_8e = local_a0;
            uStack_8c = local_a0;
            uStack_8a = local_a0;
            uStack_88 = local_a0;
            uStack_86 = local_a0;
            uStack_84 = local_a0;
            uStack_82 = local_a0;
            local_100 = (undefined2)_s1Len;
            uStack_fe = local_100;
            uStack_fc = local_100;
            uStack_fa = local_100;
            uStack_f8 = local_100;
            uStack_f6 = local_100;
            uStack_f4 = local_100;
            uStack_f2 = local_100;
            uStack_f0 = local_100;
            uStack_ee = local_100;
            uStack_ec = local_100;
            uStack_ea = local_100;
            uStack_e8 = local_100;
            uStack_e6 = local_100;
            uStack_e4 = local_100;
            uStack_e2 = local_100;
            local_c0 = (undefined2)s2Len;
            uStack_be = local_c0;
            uStack_bc = local_c0;
            uStack_ba = local_c0;
            uStack_b8 = local_c0;
            uStack_b6 = local_c0;
            uStack_b4 = local_c0;
            uStack_b2 = local_c0;
            uStack_b0 = local_c0;
            uStack_ae = local_c0;
            uStack_ac = local_c0;
            uStack_aa = local_c0;
            uStack_a8 = local_c0;
            uStack_a6 = local_c0;
            uStack_a4 = local_c0;
            uStack_a2 = local_c0;
            piVar3 = matrix->mapper;
            for (uVar26 = 0; uVar20 != uVar26; uVar26 = uVar26 + 1) {
              ptr[uVar26 + 0xf] = (int16_t)piVar3[(byte)_s2[uVar26]];
            }
            for (lVar23 = 0; uVar26 = uVar20, lVar23 != 0xf; lVar23 = lVar23 + 1) {
              ptr[lVar23] = 0;
            }
            for (; (int)uVar26 < (int)uVar14; uVar26 = uVar26 + 1) {
              ptr[uVar26 + 0xf] = 0;
            }
            for (uVar26 = 0; uVar20 != uVar26; uVar26 = uVar26 + 1) {
              ptr_00[uVar26 + 0xf] = 0;
              ptr_01[uVar26 + 0xf] = iVar31;
            }
            for (lVar23 = 0; lVar23 != 0xf; lVar23 = lVar23 + 1) {
              ptr_00[lVar23] = iVar31;
              ptr_01[lVar23] = iVar31;
            }
            for (; (int)uVar20 < (int)uVar14; uVar20 = uVar20 + 1) {
              ptr_00[uVar20 + 0xf] = iVar31;
              ptr_01[uVar20 + 0xf] = iVar31;
            }
            local_120 = _s1Len - 1;
            auVar44 = ZEXT3264(local_180);
            auVar42 = ZEXT3264(local_200);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            auVar32._4_4_ = _s1Len;
            auVar32._0_4_ = _s1Len;
            auVar32._8_4_ = _s1Len;
            auVar32._12_4_ = _s1Len;
            local_140 = vpmovsxdq_avx2(auVar32);
            local_260._8_8_ = 0x80009000a000b;
            local_260._0_8_ = 0xc000d000e000f;
            local_260._16_8_ = 0x4000500060007;
            local_260._24_8_ = 0x100020003;
            local_1c0._2_2_ = iVar31;
            local_1c0._0_2_ = iVar31;
            local_1c0._4_2_ = iVar31;
            local_1c0._6_2_ = iVar31;
            local_1c0._8_2_ = iVar31;
            local_1c0._10_2_ = iVar31;
            local_1c0._12_2_ = iVar31;
            local_1c0._14_2_ = iVar31;
            local_1c0._16_2_ = iVar31;
            local_1c0._18_2_ = iVar31;
            local_1c0._20_2_ = iVar31;
            local_1c0._22_2_ = iVar31;
            local_1c0._24_2_ = iVar31;
            local_1c0._26_2_ = iVar31;
            local_1c0._28_2_ = iVar31;
            local_1c0._30_2_ = iVar31;
            auVar45 = ZEXT3264(local_1c0);
            local_1e0._2_2_ = sVar24;
            local_1e0._0_2_ = sVar24;
            local_1e0._4_2_ = sVar24;
            local_1e0._6_2_ = sVar24;
            local_1e0._10_2_ = sVar24;
            local_1e0._8_2_ = sVar24;
            local_1e0._12_2_ = sVar24;
            local_1e0._14_2_ = sVar24;
            local_1e0._18_2_ = sVar24;
            local_1e0._16_2_ = sVar24;
            local_1e0._20_2_ = sVar24;
            local_1e0._22_2_ = sVar24;
            local_1e0._26_2_ = sVar24;
            local_1e0._24_2_ = sVar24;
            local_1e0._28_2_ = sVar24;
            local_1e0._30_2_ = sVar24;
            for (uVar20 = 0; (long)uVar20 < lVar18; uVar20 = uVar20 + 0x10) {
              if (matrix->type == 0) {
                auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_2b0 + uVar20 + 1));
                uVar28 = (uint)local_2b0[uVar20];
                uVar15 = (uint)local_2b0[uVar20 + 9];
                local_2c0 = (uint)local_2b0[uVar20 + 10];
                uVar19 = (uint)local_2b0[uVar20 + 0xb];
                local_2c8 = (uint)local_2b0[uVar20 + 0xc];
                uVar22 = (uint)local_2b0[uVar20 + 0xd];
                local_2d0 = (uint)local_2b0[uVar20 + 0xe];
                local_2d8 = (int)local_2b0[uVar20 + 0xf];
              }
              else {
                auVar34._8_8_ = uVar20;
                auVar34._0_8_ = uVar20;
                auVar34._16_8_ = uVar20;
                auVar34._24_8_ = uVar20;
                auVar35 = vpor_avx2(auVar34,_DAT_008a5be0);
                auVar34 = vpor_avx2(auVar34,_DAT_008a5c00);
                auVar9 = vpcmpgtq_avx2(local_140,auVar34);
                auVar33 = vpcmpgtq_avx2(local_140,auVar35);
                auVar9 = vpackssdw_avx2(auVar33,auVar9);
                auVar10 = vpermq_avx2(auVar9,0xd8);
                auVar9 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
                auVar33 = vpermd_avx2(auVar9,auVar35);
                auVar9 = vpermd_avx2(auVar9,auVar34);
                auVar35._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar33._0_16_;
                auVar35._16_16_ = ZEXT116(0) * auVar33._16_16_ + ZEXT116(1) * auVar9._0_16_;
                auVar33._4_4_ = local_120;
                auVar33._0_4_ = local_120;
                auVar33._8_4_ = local_120;
                auVar33._12_4_ = local_120;
                auVar33._16_4_ = local_120;
                auVar33._20_4_ = local_120;
                auVar33._24_4_ = local_120;
                auVar33._28_4_ = local_120;
                auVar9 = vblendvps_avx(auVar33,auVar35,auVar10);
                uVar28 = (uint)uVar20;
                uVar15 = uVar28 | 9;
                if (lVar18 <= (long)(uVar20 | 9)) {
                  uVar15 = local_120;
                }
                local_2c0 = uVar28 | 10;
                if (lVar18 <= (long)(uVar20 | 10)) {
                  local_2c0 = local_120;
                }
                uVar19 = uVar28 | 0xb;
                if (lVar18 <= (long)(uVar20 | 0xb)) {
                  uVar19 = local_120;
                }
                local_2c8 = uVar28 | 0xc;
                if (lVar18 <= (long)(uVar20 | 0xc)) {
                  local_2c8 = local_120;
                }
                uVar22 = uVar28 | 0xd;
                if (lVar18 <= (long)(uVar20 | 0xd)) {
                  uVar22 = local_120;
                }
                local_2d0 = uVar28 | 0xe;
                if (lVar18 <= (long)(uVar20 | 0xe)) {
                  local_2d0 = local_120;
                }
                local_2d8 = uVar28 | 0xf;
                if (lVar18 <= (long)(uVar20 | 0xf)) {
                  local_2d8 = local_120;
                }
              }
              iVar16 = matrix->size;
              iVar25 = vextractps_avx(auVar9._16_16_,2);
              iVar27 = vextractps_avx(auVar9._0_16_,2);
              piVar3 = matrix->matrix;
              auVar7._2_2_ = local_100;
              auVar7._0_2_ = local_100;
              auVar7._4_2_ = local_100;
              auVar7._6_2_ = local_100;
              auVar7._8_2_ = local_100;
              auVar7._10_2_ = local_100;
              auVar7._12_2_ = local_100;
              auVar7._14_2_ = local_100;
              auVar7._16_2_ = local_100;
              auVar7._18_2_ = local_100;
              auVar7._20_2_ = local_100;
              auVar7._22_2_ = local_100;
              auVar7._24_2_ = local_100;
              auVar7._26_2_ = local_100;
              auVar7._28_2_ = local_100;
              auVar7._30_2_ = local_100;
              auVar7 = vpcmpgtw_avx2(auVar7,local_260);
              auVar10._2_2_ = iVar31;
              auVar10._0_2_ = iVar31;
              auVar10._4_2_ = iVar31;
              auVar10._6_2_ = iVar31;
              auVar10._8_2_ = iVar31;
              auVar10._10_2_ = iVar31;
              auVar10._12_2_ = iVar31;
              auVar10._14_2_ = iVar31;
              auVar10._16_2_ = iVar31;
              auVar10._18_2_ = iVar31;
              auVar10._20_2_ = iVar31;
              auVar10._22_2_ = iVar31;
              auVar10._24_2_ = iVar31;
              auVar10._26_2_ = iVar31;
              auVar10._28_2_ = iVar31;
              auVar10._30_2_ = iVar31;
              auVar33 = vpmovsxbw_avx2(_DAT_008a5c84);
              auVar38 = local_e0;
              auVar35 = local_e0;
              auVar34 = auVar10;
              for (uVar26 = 0; (~((int)uVar14 >> 0x1f) & uVar14) != uVar26; uVar26 = uVar26 + 1) {
                auVar5 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(iVar25 * iVar16) +
                                                          (long)ptr[uVar26 + 8]]),
                                     (uint)*(ushort *)
                                            (piVar3 + (long)(auVar9._20_4_ * iVar16) +
                                                      (long)ptr[uVar26 + 9]),1);
                auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                   (piVar3 + (long)(auVar9._16_4_ * iVar16) +
                                                             (long)ptr[uVar26 + 10]),2);
                auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                   (piVar3 + (long)(auVar9._12_4_ * iVar16) +
                                                             (long)ptr[uVar26 + 0xb]),3);
                auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                   (piVar3 + (long)(iVar27 * iVar16) +
                                                             (long)ptr[uVar26 + 0xc]),4);
                auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                   (piVar3 + (long)(auVar9._4_4_ * iVar16) +
                                                             (long)ptr[uVar26 + 0xd]),5);
                auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                   (piVar3 + (long)(auVar9._0_4_ * iVar16) +
                                                             (long)ptr[uVar26 + 0xe]),6);
                auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar28 * iVar16) +
                                                             (long)ptr[uVar26 + 0xf]),7);
                auVar32 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(local_2d8 * iVar16) +
                                                           (long)ptr[uVar26]]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(local_2d0 * iVar16) +
                                                       (long)ptr[uVar26 + 1]),1);
                auVar32 = vpinsrw_avx(auVar32,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar22 * iVar16) +
                                                               (long)ptr[uVar26 + 2]),2);
                auVar32 = vpinsrw_avx(auVar32,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_2c8 * iVar16) +
                                                               (long)ptr[uVar26 + 3]),3);
                auVar32 = vpinsrw_avx(auVar32,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar19 * iVar16) +
                                                               (long)ptr[uVar26 + 4]),4);
                auVar32 = vpinsrw_avx(auVar32,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_2c0 * iVar16) +
                                                               (long)ptr[uVar26 + 5]),5);
                auVar32 = vpinsrw_avx(auVar32,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar15 * iVar16) +
                                                               (long)ptr[uVar26 + 6]),6);
                auVar32 = vpinsrw_avx(auVar32,(uint)*(ushort *)
                                                     (piVar3 + (long)(auVar9._28_4_ * iVar16) +
                                                               (long)ptr[uVar26 + 7]),7);
                auVar40 = vpalignr_avx2(ZEXT1632(auVar35._16_16_),auVar35,2);
                iVar1 = ptr_00[uVar26 + 0xf];
                auVar39._2_2_ = iVar1;
                auVar39._0_2_ = iVar1;
                auVar39._4_2_ = iVar1;
                auVar39._6_2_ = iVar1;
                auVar39._8_2_ = iVar1;
                auVar39._10_2_ = iVar1;
                auVar39._12_2_ = iVar1;
                auVar39._14_2_ = iVar1;
                auVar39._16_2_ = iVar1;
                auVar39._18_2_ = iVar1;
                auVar39._20_2_ = iVar1;
                auVar39._22_2_ = iVar1;
                auVar39._24_2_ = iVar1;
                auVar39._26_2_ = iVar1;
                auVar39._28_2_ = iVar1;
                auVar39._30_2_ = iVar1;
                auVar39 = vpblendw_avx2(auVar40,auVar39,0x80);
                auVar39 = vpblendd_avx2(auVar40,auVar39,0xf0);
                iVar1 = ptr_01[uVar26 + 0xf];
                auVar40._2_2_ = iVar1;
                auVar40._0_2_ = iVar1;
                auVar40._4_2_ = iVar1;
                auVar40._6_2_ = iVar1;
                auVar40._8_2_ = iVar1;
                auVar40._10_2_ = iVar1;
                auVar40._12_2_ = iVar1;
                auVar40._14_2_ = iVar1;
                auVar40._16_2_ = iVar1;
                auVar40._18_2_ = iVar1;
                auVar40._20_2_ = iVar1;
                auVar40._22_2_ = iVar1;
                auVar40._24_2_ = iVar1;
                auVar40._26_2_ = iVar1;
                auVar40._28_2_ = iVar1;
                auVar40._30_2_ = iVar1;
                auVar34 = vpalignr_avx2(ZEXT1632(auVar34._16_16_),auVar34,2);
                auVar40 = vpblendw_avx2(auVar34,auVar40,0x80);
                auVar40 = vpblendd_avx2(auVar34,auVar40,0xf0);
                auVar6._2_2_ = local_80;
                auVar6._0_2_ = local_80;
                auVar6._4_2_ = local_80;
                auVar6._6_2_ = local_80;
                auVar6._8_2_ = local_80;
                auVar6._10_2_ = local_80;
                auVar6._12_2_ = local_80;
                auVar6._14_2_ = local_80;
                auVar6._16_2_ = local_80;
                auVar6._18_2_ = local_80;
                auVar6._20_2_ = local_80;
                auVar6._22_2_ = local_80;
                auVar6._24_2_ = local_80;
                auVar6._26_2_ = local_80;
                auVar6._28_2_ = local_80;
                auVar6._30_2_ = local_80;
                auVar34 = vpsubsw_avx2(auVar39,auVar6);
                auVar41._2_2_ = local_a0;
                auVar41._0_2_ = local_a0;
                auVar41._4_2_ = local_a0;
                auVar41._6_2_ = local_a0;
                auVar41._8_2_ = local_a0;
                auVar41._10_2_ = local_a0;
                auVar41._12_2_ = local_a0;
                auVar41._14_2_ = local_a0;
                auVar41._16_2_ = local_a0;
                auVar41._18_2_ = local_a0;
                auVar41._20_2_ = local_a0;
                auVar41._22_2_ = local_a0;
                auVar41._24_2_ = local_a0;
                auVar41._26_2_ = local_a0;
                auVar41._28_2_ = local_a0;
                auVar41._30_2_ = local_a0;
                auVar40 = vpsubsw_avx2(auVar40,auVar41);
                auVar34 = vpmaxsw_avx2(auVar34,auVar40);
                auVar35 = vpsubsw_avx2(auVar35,auVar6);
                auVar10 = vpsubsw_avx2(auVar10,auVar41);
                auVar40 = vpmaxsw_avx2(auVar35,auVar10);
                auVar37._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar32;
                auVar37._16_16_ = ZEXT116(1) * auVar5;
                auVar35 = vpaddsw_avx2(auVar38,auVar37);
                auVar10 = vpmaxsw_avx2(auVar40,auVar34);
                auVar10 = vpmaxsw_avx2(auVar10,_DAT_008a5840);
                auVar38 = vpmaxsw_avx2(auVar35,auVar10);
                auVar10 = vpcmpeqw_avx2(auVar33,_DAT_008a5a80);
                auVar35 = vpandn_avx2(auVar10,auVar38);
                auVar8._2_2_ = iVar31;
                auVar8._0_2_ = iVar31;
                auVar8._4_2_ = iVar31;
                auVar8._6_2_ = iVar31;
                auVar8._8_2_ = iVar31;
                auVar8._10_2_ = iVar31;
                auVar8._12_2_ = iVar31;
                auVar8._14_2_ = iVar31;
                auVar8._16_2_ = iVar31;
                auVar8._18_2_ = iVar31;
                auVar8._20_2_ = iVar31;
                auVar8._22_2_ = iVar31;
                auVar8._24_2_ = iVar31;
                auVar8._26_2_ = iVar31;
                auVar8._28_2_ = iVar31;
                auVar8._30_2_ = iVar31;
                auVar34 = vpblendvb_avx2(auVar34,auVar8,auVar10);
                if (0xf < uVar26) {
                  local_1e0 = vpminsw_avx2(local_1e0,auVar35);
                  local_1c0 = vpmaxsw_avx2(local_1c0,auVar35);
                }
                auVar13._2_2_ = local_c0;
                auVar13._0_2_ = local_c0;
                auVar13._4_2_ = local_c0;
                auVar13._6_2_ = local_c0;
                auVar13._8_2_ = local_c0;
                auVar13._10_2_ = local_c0;
                auVar13._12_2_ = local_c0;
                auVar13._14_2_ = local_c0;
                auVar13._16_2_ = local_c0;
                auVar13._18_2_ = local_c0;
                auVar13._20_2_ = local_c0;
                auVar13._22_2_ = local_c0;
                auVar13._24_2_ = local_c0;
                auVar13._26_2_ = local_c0;
                auVar13._28_2_ = local_c0;
                auVar13._30_2_ = local_c0;
                auVar8 = vpcmpgtw_avx2(auVar13,auVar33);
                auVar8 = vpand_avx2(auVar7,auVar8);
                auVar41 = vpsraw_avx2(auVar33,0xf);
                auVar41 = vpandn_avx2(auVar41,auVar8);
                auVar5 = vpacksswb_avx(auVar41._0_16_,auVar41._16_16_);
                auVar43 = auVar44._0_32_;
                auVar6 = vpcmpeqw_avx2(auVar43,auVar35);
                auVar37 = vpcmpgtw_avx2(auVar35,auVar43);
                auVar8 = vpand_avx2(auVar37,auVar41);
                auVar38 = vpblendvb_avx2(auVar43,auVar38,auVar8);
                auVar44 = ZEXT3264(auVar38);
                auVar32 = vpacksswb_avx(auVar8._0_16_,auVar8._16_16_);
                auVar38 = vpcmpgtw_avx2(auVar42._0_32_,auVar33);
                auVar38 = vpand_avx2(auVar6,auVar38);
                auVar4 = vpacksswb_avx(auVar38._0_16_,auVar38._16_16_);
                auVar5 = vpblendvb_avx(auVar32,auVar5,auVar4);
                auVar43._2_2_ = iVar31;
                auVar43._0_2_ = iVar31;
                auVar43._4_2_ = iVar31;
                auVar43._6_2_ = iVar31;
                auVar43._8_2_ = iVar31;
                auVar43._10_2_ = iVar31;
                auVar43._12_2_ = iVar31;
                auVar43._14_2_ = iVar31;
                auVar43._16_2_ = iVar31;
                auVar43._18_2_ = iVar31;
                auVar43._20_2_ = iVar31;
                auVar43._22_2_ = iVar31;
                auVar43._24_2_ = iVar31;
                auVar43._26_2_ = iVar31;
                auVar43._28_2_ = iVar31;
                auVar43._30_2_ = iVar31;
                auVar10 = vpblendvb_avx2(auVar40,auVar43,auVar10);
                auVar40 = vpmovsxbw_avx2(auVar5);
                auVar40 = vpblendvb_avx2(auVar45._0_32_,local_260,auVar40);
                auVar45 = ZEXT3264(auVar40);
                auVar38 = vpor_avx2(auVar38,auVar37);
                auVar38 = vpand_avx2(auVar41,auVar38);
                auVar38 = vpblendvb_avx2(auVar42._0_32_,auVar33,auVar38);
                auVar42 = ZEXT3264(auVar38);
                auVar38._8_2_ = 1;
                auVar38._0_8_ = 0x1000100010001;
                auVar38._10_2_ = 1;
                auVar38._12_2_ = 1;
                auVar38._14_2_ = 1;
                auVar38._16_2_ = 1;
                auVar38._18_2_ = 1;
                auVar38._20_2_ = 1;
                auVar38._22_2_ = 1;
                auVar38._24_2_ = 1;
                auVar38._26_2_ = 1;
                auVar38._28_2_ = 1;
                auVar38._30_2_ = 1;
                auVar33 = vpaddsw_avx2(auVar33,auVar38);
                vpextrw_avx(auVar35._0_16_,0);
                vpextrw_avx(auVar34._0_16_,0);
                auVar38 = auVar39;
              }
              auVar36._8_2_ = 0x10;
              auVar36._0_8_ = 0x10001000100010;
              auVar36._10_2_ = 0x10;
              auVar36._12_2_ = 0x10;
              auVar36._14_2_ = 0x10;
              auVar36._16_2_ = 0x10;
              auVar36._18_2_ = 0x10;
              auVar36._20_2_ = 0x10;
              auVar36._22_2_ = 0x10;
              auVar36._24_2_ = 0x10;
              auVar36._26_2_ = 0x10;
              auVar36._28_2_ = 0x10;
              auVar36._30_2_ = 0x10;
              local_260 = vpaddsw_avx2(local_260,auVar36);
            }
            local_180 = auVar44._0_32_;
            local_200 = auVar42._0_32_;
            local_1a0 = auVar45._0_32_;
            iVar25 = 0;
            iVar16 = 0;
            for (lVar18 = 0; uVar29 = (ushort)uVar30, (int)lVar18 != 0x10; lVar18 = lVar18 + 1) {
              uVar2 = *(ushort *)(local_180 + lVar18 * 2);
              if ((short)uVar29 < (short)uVar2) {
                iVar16 = (int)*(short *)(local_1a0 + lVar18 * 2);
                iVar25 = (int)*(short *)(local_200 + lVar18 * 2);
                uVar30 = (uint)uVar2;
              }
              else if (uVar2 == uVar29) {
                iVar27 = (int)*(short *)(local_200 + lVar18 * 2);
                if (iVar27 < iVar25) {
                  iVar16 = (int)*(short *)(local_1a0 + lVar18 * 2);
                  iVar25 = iVar27;
                }
                else if ((iVar25 == iVar27) && (*(short *)(local_1a0 + lVar18 * 2) <= iVar16)) {
                  iVar16 = (int)*(short *)(local_1a0 + lVar18 * 2);
                }
              }
            }
            auVar11._2_2_ = iVar31;
            auVar11._0_2_ = iVar31;
            auVar11._4_2_ = iVar31;
            auVar11._6_2_ = iVar31;
            auVar11._8_2_ = iVar31;
            auVar11._10_2_ = iVar31;
            auVar11._12_2_ = iVar31;
            auVar11._14_2_ = iVar31;
            auVar11._16_2_ = iVar31;
            auVar11._18_2_ = iVar31;
            auVar11._20_2_ = iVar31;
            auVar11._22_2_ = iVar31;
            auVar11._24_2_ = iVar31;
            auVar11._26_2_ = iVar31;
            auVar11._28_2_ = iVar31;
            auVar11._30_2_ = iVar31;
            auVar9 = vpcmpgtw_avx2(auVar11,local_1e0);
            auVar12._2_2_ = sVar24;
            auVar12._0_2_ = sVar24;
            auVar12._4_2_ = sVar24;
            auVar12._6_2_ = sVar24;
            auVar12._8_2_ = sVar24;
            auVar12._10_2_ = sVar24;
            auVar12._12_2_ = sVar24;
            auVar12._14_2_ = sVar24;
            auVar12._16_2_ = sVar24;
            auVar12._18_2_ = sVar24;
            auVar12._20_2_ = sVar24;
            auVar12._22_2_ = sVar24;
            auVar12._24_2_ = sVar24;
            auVar12._26_2_ = sVar24;
            auVar12._28_2_ = sVar24;
            auVar12._30_2_ = sVar24;
            auVar33 = vpcmpgtw_avx2(local_1c0,auVar12);
            auVar9 = vpor_avx2(auVar9,auVar33);
            if ((((((((((((((((((((((((((((((((auVar9 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar9 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar9 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar9 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar9 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar9 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar9 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar9 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar9 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar9 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar9 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar9 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar9 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar9 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || SUB321(auVar9 >> 0x7f,0) != '\0') ||
                              (auVar9 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar9 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar9 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar9 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar9 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar9 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar9 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar9 >> 0xbf,0) != '\0') ||
                      (auVar9 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar9 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar9 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar9 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar9 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar9[0x1f] < '\0') {
              *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
              uVar29 = 0;
              iVar25 = 0;
              iVar16 = 0;
            }
            ppVar17->score = (int)(short)uVar29;
            ppVar17->end_query = iVar16;
            ppVar17->end_ref = iVar25;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_2b0);
              return ppVar17;
            }
            return ppVar17;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar21 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_00713a73;
        __format = "%s: %s must be > 0\n";
        pcVar21 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_diag_avx2_256_16",pcVar21);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}